

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_reopen(sqlite3_blob *pBlob,sqlite3_int64 iRow)

{
  char *zFormat;
  char *local_40;
  char *zErr;
  sqlite3 *db;
  Incrblob *p;
  sqlite3_int64 sStack_20;
  int rc;
  sqlite3_int64 iRow_local;
  sqlite3_blob *pBlob_local;
  
  db = (sqlite3 *)pBlob;
  sStack_20 = iRow;
  iRow_local = (sqlite3_int64)pBlob;
  if (pBlob == (sqlite3_blob *)0x0) {
    pBlob_local._4_4_ = sqlite3MisuseError(0x17d31);
  }
  else {
    zErr = *(char **)(pBlob + 0x20);
    sqlite3_mutex_enter(*(sqlite3_mutex **)(zErr + 0x18));
    if (db->mutex == (sqlite3_mutex *)0x0) {
      p._4_4_ = 4;
    }
    else {
      db->mutex[1].mutex.__data.__nusers = 0;
      p._4_4_ = blobSeekToRow((Incrblob *)db,sStack_20,&local_40);
      if (p._4_4_ != 0) {
        zFormat = (char *)0x0;
        if (local_40 != (char *)0x0) {
          zFormat = "%s";
        }
        sqlite3ErrorWithMsg((sqlite3 *)zErr,p._4_4_,zFormat,local_40);
        sqlite3DbFree((sqlite3 *)zErr,local_40);
      }
    }
    p._4_4_ = sqlite3ApiExit((sqlite3 *)zErr,p._4_4_);
    sqlite3_mutex_leave(*(sqlite3_mutex **)(zErr + 0x18));
    pBlob_local._4_4_ = p._4_4_;
  }
  return pBlob_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_blob_reopen(sqlite3_blob *pBlob, sqlite3_int64 iRow){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);

  if( p->pStmt==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    char *zErr;
    ((Vdbe*)p->pStmt)->rc = SQLITE_OK;
    rc = blobSeekToRow(p, iRow, &zErr);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
      sqlite3DbFree(db, zErr);
    }
    assert( rc!=SQLITE_SCHEMA );
  }

  rc = sqlite3ApiExit(db, rc);
  assert( rc==SQLITE_OK || p->pStmt==0 );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}